

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr CheckEvent(_Bool wait)

{
  short sVar1;
  short sVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  Window WVar5;
  bool bVar6;
  bool bVar7;
  int *piVar8;
  int iVar9;
  wchar_t oy;
  wchar_t ox;
  wchar_t force_resize;
  wchar_t hgt;
  wchar_t wid;
  wchar_t rows;
  wchar_t cols;
  wchar_t y2;
  wchar_t y1;
  wchar_t x2;
  wchar_t x1;
  uint32_t state;
  wchar_t y;
  wchar_t x;
  wchar_t z;
  wchar_t wStack_f4;
  _Bool press;
  wchar_t window;
  wchar_t i;
  infowin *iwin;
  term_data *td;
  XEvent *xev;
  XEvent xev_body;
  term_data *old_td;
  _Bool wait_local;
  
  xev_body.pad[0x17] = (long)Term->data;
  td = (term_data *)&xev;
  iwin = (infowin *)0x0;
  _window = (infowin *)0x0;
  z = L'\0';
  old_td._3_1_ = wait;
  if ((wait) || (iVar9 = XPending(Metadpy->dpy), iVar9 != 0)) {
    wStack_f4 = 0;
    while (iVar9 = XPending(Metadpy->dpy), iVar9 == 0) {
      if (wStack_f4 == 0) {
        idle_update();
      }
      usleep(20000);
      wStack_f4 = (wStack_f4 + 1) % 10;
    }
    XNextEvent(Metadpy->dpy,td);
    if (*(int *)&(td->t).user == 0x22) {
      XRefreshKeyboardMapping(td);
      old_td._4_4_ = 0;
    }
    else {
      for (wStack_f4 = L'\0'; wStack_f4 < L'\b'; wStack_f4 = wStack_f4 + L'\x01') {
        WVar5._0_4_ = (td->t).sidebar_mode;
        WVar5._4_1_ = (td->t).complex_input;
        WVar5._5_3_ = *(undefined3 *)&(td->t).field_0x25;
        if (WVar5 == (data[wStack_f4].win)->win) {
          iwin = (infowin *)(data + wStack_f4);
          _window = data[wStack_f4].win;
          z = wStack_f4;
          break;
        }
      }
      if ((iwin == (infowin *)0x0) || (_window == (infowin *)0x0)) {
        old_td._4_4_ = 0;
      }
      else {
        Term_activate((term *)iwin);
        Infowin = _window;
        switch(*(undefined4 *)&(td->t).user) {
        case 2:
          Term_activate((term *)xev_body.pad[0x17]);
          react_keypress((XKeyEvent *)td);
          break;
        case 4:
          x._3_1_ = *(int *)&(td->t).user == 4;
          state = (td->t).y1;
          x1 = (td->t).y2;
          if (*(int *)((long)&(td->t).x2 + 4) == 1) {
            y = L'\x01';
          }
          else if (*(int *)((long)&(td->t).x2 + 4) == 2) {
            y = L'\x02';
          }
          else if (*(int *)((long)&(td->t).x2 + 4) == 3) {
            y = L'\x03';
          }
          else if (*(int *)((long)&(td->t).x2 + 4) == 4) {
            y = L'\x04';
          }
          else if (*(int *)((long)&(td->t).x2 + 4) == 5) {
            y = L'\x05';
          }
          else {
            y = L'\0';
          }
          piVar8 = (td->t).x2;
          if (((ulong)piVar8 & 1) != 0) {
            y = y | 0x20;
          }
          if (((ulong)piVar8 & 4) != 0) {
            y = y | 0x10;
          }
          if (((ulong)piVar8 & 8) != 0) {
            y = y | 0x40;
          }
          pixel_to_square((int *)&state,&x1,state,x1);
          if ((x._3_1_ & 1) != 0) {
            Term_mousepress(state,x1,(char)y);
          }
          break;
        case 0xc:
          Term_redraw_section((*(int *)&(td->t).key_queue - (int)_window->ox) / *(int *)&iwin[5].b,
                              (*(int *)((long)&(td->t).key_queue + 4) - (int)_window->oy) /
                              (int)iwin[6].win,
                              ((*(int *)&(td->t).key_queue + *(int *)&(td->t).key_head) -
                              (int)_window->ox) / *(int *)&iwin[5].b,
                              ((*(int *)((long)&(td->t).key_queue + 4) + *(int *)&(td->t).key_xtra)
                              - (int)_window->oy) / (int)iwin[6].win);
          break;
        case 0x12:
          _window->field_0x23 = _window->field_0x23 & 0xfe;
          Term->mapped_flag = false;
          break;
        case 0x13:
          _window->field_0x23 = _window->field_0x23 & 0xfe | 1;
          Term->mapped_flag = true;
          break;
        case 0x16:
          sVar1 = _window->ox;
          sVar2 = _window->oy;
          uVar3 = (td->t).key_head;
          _window->x = uVar3;
          uVar4 = (td->t).key_xtra;
          Infowin->y = uVar4;
          Infowin->w = (int16_t)(td->t).wid;
          Infowin->h = (int16_t)(td->t).hgt;
          wid = ((int)Infowin->w + sVar1 * -2) / *(int *)&iwin[5].b;
          hgt = ((int)Infowin->h + sVar2 * -2) / (int)iwin[6].win;
          if (wid < L'\x01') {
            wid = L'\x01';
          }
          if (hgt < L'\x01') {
            hgt = L'\x01';
          }
          if (z == L'\0') {
            bVar6 = wid < L'P';
            if (bVar6) {
              wid = L'P';
            }
            bVar7 = hgt < L'\x18';
            if (bVar7) {
              hgt = L'\x18';
            }
            if (bVar7 || bVar6) {
              Infowin = *(infowin **)&iwin[5].x_save;
              Infowin_resize(wid * *(int *)&iwin[5].b + sVar1 * 2,hgt * (int)iwin[6].win + sVar2 * 2
                            );
            }
          }
          Term_resize(wid,hgt);
        }
        Term_activate((term *)xev_body.pad[0x17]);
        Infowin = *(infowin **)(xev_body.pad[0x17] + 0xe0);
        old_td._4_4_ = 0;
      }
    }
  }
  else {
    old_td._4_4_ = 1;
  }
  return old_td._4_4_;
}

Assistant:

static errr CheckEvent(bool wait)
{
	term_data *old_td = (term_data*)(Term->data);

	XEvent xev_body, *xev = &xev_body;

	term_data *td = NULL;
	infowin *iwin = NULL;

	int i;
	int window = 0;

	/* Do not wait unless requested */
	if (!wait && !XPending(Metadpy->dpy)) return (1);

	/* Wait in 0.02s increments while updating animations every 0.2s */
	i = 0;
	while (!XPending(Metadpy->dpy)) {
		if (i == 0) idle_update();
		usleep(20000);
		i = (i + 1) % 10;
	}

	/* Load the Event */
	XNextEvent(Metadpy->dpy, xev);


	/* Notice new keymaps */
	if (xev->type == MappingNotify) {
		XRefreshKeyboardMapping(&xev->xmapping);
		return 0;
	}


	/* Scan the windows */
	for (i = 0; i < MAX_TERM_DATA; i++) {
		if (xev->xany.window == data[i].win->win) {
			td = &data[i];
			iwin = td->win;
			window = i;
			break;
		}
	}

	/* Unknown window */
	if (!td || !iwin) return (0);

	/* Hack -- activate the Term */
	Term_activate(&td->t);

	/* Hack -- activate the window */
	Infowin_set(iwin);

	/* Switch on the Type */
	switch (xev->type)
	{
		case ButtonPress:
		{
			bool press = (xev->type == ButtonPress);

			int z = 0;

			/* Where is the mouse */
			int x = xev->xbutton.x;
			int y = xev->xbutton.y;

			/* Which button is involved */
			if (xev->xbutton.button == Button1) z = 1;
			else if (xev->xbutton.button == Button2) z = 2;
			else if (xev->xbutton.button == Button3) z = 3;
			else if (xev->xbutton.button == Button4) z = 4;
			else if (xev->xbutton.button == Button5) z = 5;
			else z = 0;

			/* Save a byte in ui-term/Term_mousepress for some reason */
			uint32_t state = ((XButtonEvent*) xev)->state;
			if(state & ShiftMask) {
				z |= (KC_MOD_SHIFT << 4);
			}
			if(state & ControlMask) {
				z |= (KC_MOD_CONTROL << 4);
			}
			if(state & Mod1Mask) {
				z |= (KC_MOD_ALT << 4);
			}

			/* The co-ordinates are only used in Angband format. */
			pixel_to_square(&x, &y, x, y);
			if (press) Term_mousepress(x, y, z);

			break;
		}

		case KeyPress:
		{
			/* Hack -- use "old" term */
			Term_activate(&old_td->t);

			/* Process the key */
			react_keypress(&(xev->xkey));

			break;
		}

		case Expose:
		{
			int x1, x2, y1, y2;

			x1 = (xev->xexpose.x - Infowin->ox) / td->tile_wid;
			x2 = (xev->xexpose.x + xev->xexpose.width - Infowin->ox) /
				td->tile_wid;

			y1 = (xev->xexpose.y - Infowin->oy) / td->tile_hgt;
			y2 = (xev->xexpose.y + xev->xexpose.height - Infowin->oy) /
				td->tile_hgt;

			Term_redraw_section(x1, y1, x2, y2);

			break;
		}

		case MapNotify:
		{
			Infowin->mapped = 1;
			Term->mapped_flag = true;
			break;
		}

		case UnmapNotify:
		{
			Infowin->mapped = 0;
			Term->mapped_flag = false;
			break;
		}

		/* Move and/or Resize */
		case ConfigureNotify:
		{
			int cols, rows, wid, hgt, force_resize;

			int ox = Infowin->ox;
			int oy = Infowin->oy;

			/* Save the new Window Parms */
			Infowin->x = xev->xconfigure.x;
			Infowin->y = xev->xconfigure.y;
			Infowin->w = xev->xconfigure.width;
			Infowin->h = xev->xconfigure.height;

			/* Determine "proper" number of rows/cols */
			cols = ((Infowin->w - (ox + ox)) / td->tile_wid);
			rows = ((Infowin->h - (oy + oy)) / td->tile_hgt);

			/* Hack -- minimal size */
			if (cols < 1) cols = 1;
			if (rows < 1) rows = 1;

			if (window == 0) {
				/* Hack the main window must be at least 80x24 */
				force_resize = false;
				if (cols < 80) {
					cols = 80;
					force_resize = true;
				}
				if (rows < 24) {
					rows = 24;
					force_resize = true;
				}

				/* Resize the windows if any "change" is needed */
				if (force_resize) {
					/* Desired size of window */
					wid = cols * td->tile_wid + (ox + ox);
					hgt = rows * td->tile_hgt + (oy + oy);

					/* Resize window */
					Infowin_set(td->win);
					Infowin_resize(wid, hgt);
				}
			}

			/* Resize the Term (if needed) */
			(void)Term_resize(cols, rows);

			break;
		}
	}

	/* Hack -- Activate the old term */
	Term_activate(&old_td->t);

	/* Hack -- Activate the proper window */
	Infowin_set(old_td->win);

	/* Success */
	return (0);
}